

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O1

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (IntResult *__return_storage_ptr__,NumberParser *this,Preprocessor *stream)

{
  IntResult *pIVar1;
  bool bVar2;
  uint uVar3;
  SourceLocation SVar4;
  Info *pIVar5;
  int iVar9;
  Token TVar10;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar11;
  Token TVar12;
  Token sizeToken_00;
  Token baseToken;
  Token sizeToken;
  Token first;
  Token token;
  anon_class_16_2_049d3a7c createSimple;
  Token local_e8;
  IntResult *local_d0;
  Token local_c8;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token *local_88;
  NumberParser *pNStack_80;
  Token local_78;
  Token local_68;
  Token local_50;
  Token local_40;
  undefined8 uVar6;
  undefined8 uVar7;
  Info *pIVar8;
  
  Token::Token(&local_c8);
  Token::Token(&local_e8);
  TVar10 = Preprocessor::consume(stream);
  local_d0 = __return_storage_ptr__;
  local_98 = TVar10;
  if (TVar10.kind == IntegerBase) {
    local_e8 = TVar10;
    Token::Token(&local_40);
  }
  else {
    local_88 = &local_98;
    pNStack_80 = this;
    bVar2 = Preprocessor::peekSameLine(stream);
    if ((!bVar2) ||
       (TVar12 = Preprocessor::peek(stream), TVar10 = local_98, TVar12.kind != IntegerBase)) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_049d3a7c::operator()
                (__return_storage_ptr__,(anon_class_16_2_049d3a7c *)&local_88);
      return __return_storage_ptr__;
    }
    local_c8.kind = local_98.kind;
    local_c8._2_1_ = local_98._2_1_;
    local_c8.numFlags.raw = local_98.numFlags.raw;
    local_c8.rawLen = local_98.rawLen;
    local_c8.info = local_98.info;
    local_98 = TVar10;
    TVar10 = Preprocessor::consume(stream);
    local_40._0_8_ = local_c8._0_8_;
    local_40.info = local_c8.info;
    local_e8 = TVar10;
  }
  TVar12.info = local_40.info;
  TVar12.kind = local_40.kind;
  TVar12._2_1_ = local_40._2_1_;
  TVar12.numFlags.raw = local_40.numFlags.raw;
  TVar12.rawLen = local_40.rawLen;
  startVector(this,TVar10,TVar12);
  bVar2 = Preprocessor::peekSameLine(stream);
  pIVar5 = local_c8.info;
  uVar6 = local_c8._0_8_;
  if (bVar2) {
    local_a8 = Preprocessor::peek(stream);
    bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_a8.kind);
    if (bVar2) {
      local_b8 = local_a8;
      SVar4 = Token::location(&local_a8);
      this->firstLocation = SVar4;
      iVar9 = 0;
      do {
        uVar3 = append(this,local_b8,iVar9 == 0);
        Preprocessor::consume(stream);
        if ((int)uVar3 < 0) {
          iVar9 = iVar9 + 1;
          bVar2 = Preprocessor::peekSameLine(stream);
          if (!bVar2) goto LAB_0019de0f;
          local_b8 = Preprocessor::peek(stream);
          bVar2 = true;
        }
        else {
          local_88 = (Token *)local_b8._0_8_;
          pNStack_80 = (NumberParser *)local_b8.info;
          SVar4 = Token::location((Token *)&local_88);
          Preprocessor::addDiag
                    (stream,(DiagCode)0x80004,
                     (SourceLocation)((ulong)uVar3 * 0x10000000 + (long)SVar4));
          iVar9 = iVar9 + 2;
LAB_0019de0f:
          bVar2 = false;
        }
        if (!bVar2) {
LAB_0019de34:
          TVar10 = local_e8;
          local_68.kind = local_c8.kind;
          local_68._2_1_ = local_c8._2_1_;
          local_68.numFlags.raw = local_c8.numFlags.raw;
          local_68.rawLen = local_c8.rawLen;
          local_68.info = local_c8.info;
          local_78.kind = local_e8.kind;
          local_78._2_1_ = local_e8._2_1_;
          local_78.numFlags.raw = local_e8.numFlags.raw;
          local_78.rawLen = local_e8.rawLen;
          local_78.info = local_e8.info;
          local_e8 = TVar10;
          TVar10 = finishValue(this,local_a8,iVar9 == 1);
          (local_d0->size).kind = local_68.kind;
          (local_d0->size).field_0x2 = local_68._2_1_;
          (local_d0->size).numFlags = (NumericTokenFlags)local_68.numFlags.raw;
          (local_d0->size).rawLen = local_68.rawLen;
          (local_d0->size).info = local_68.info;
          (local_d0->base).kind = local_78.kind;
          (local_d0->base).field_0x2 = local_78._2_1_;
          (local_d0->base).numFlags = (NumericTokenFlags)local_78.numFlags.raw;
          (local_d0->base).rawLen = local_78.rawLen;
          (local_d0->base).info = local_78.info;
          local_d0->value = TVar10;
          local_d0->isSimple = false;
          return local_d0;
        }
        bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_b8.kind);
        if ((!bVar2) || (sVar11 = Token::trivia(&local_b8), sVar11.size_ != 0)) goto LAB_0019de34;
      } while( true );
    }
    pIVar5 = local_c8.info;
    uVar6 = local_c8._0_8_;
    uVar7 = local_e8._0_8_;
    pIVar8 = local_e8.info;
    local_50._0_8_ = local_a8._0_8_;
    local_50.info = local_a8.info;
  }
  else {
    uVar7 = local_e8._0_8_;
    pIVar8 = local_e8.info;
    Token::Token(&local_50);
  }
  pIVar1 = local_d0;
  TVar10.info = local_50.info;
  TVar10.kind = local_50.kind;
  TVar10._2_1_ = local_50._2_1_;
  TVar10.numFlags.raw = local_50.numFlags.raw;
  TVar10.rawLen = local_50.rawLen;
  sizeToken_00.info = pIVar5;
  sizeToken_00.kind = (TokenKind)uVar6;
  sizeToken_00._2_1_ = SUB81(uVar6,2);
  sizeToken_00.numFlags.raw = SUB81(uVar6,3);
  sizeToken_00.rawLen = SUB84(uVar6,4);
  baseToken.info = pIVar8;
  baseToken.kind = (TokenKind)uVar7;
  baseToken._2_1_ = SUB81(uVar7,2);
  baseToken.numFlags.raw = SUB81(uVar7,3);
  baseToken.rawLen = SUB84(uVar7,4);
  reportMissingDigits(local_d0,this,sizeToken_00,baseToken,TVar10);
  return pIVar1;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                if (token.intValue() > INT32_MAX)
                    reportIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1));
    }